

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

SUNErrCode SUNLinSolSetATimes(SUNLinearSolver S,void *A_data,SUNATimesFn ATimes)

{
  _func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->setatimes;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(S,A_data,ATimes);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetATimes(SUNLinearSolver S, void* A_data, SUNATimesFn ATimes)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setatimes) { ier = S->ops->setatimes(S, A_data, ATimes); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (ier);
}